

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O1

void __thiscall
JtagAnalyzerResults::JtagAnalyzerResults
          (JtagAnalyzerResults *this,JtagAnalyzer *analyzer,JtagAnalyzerSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  AnalyzerResults::AnalyzerResults(&this->super_AnalyzerResults);
  *(undefined ***)this = &PTR__JtagAnalyzerResults_00110cf8;
  this->mSettings = settings;
  this->mAnalyzer = analyzer;
  p_Var1 = &(this->mShiftedData)._M_t._M_impl.super__Rb_tree_header;
  (this->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

JtagAnalyzerResults::JtagAnalyzerResults( JtagAnalyzer* analyzer, JtagAnalyzerSettings* settings )
    : mSettings( settings ), mAnalyzer( analyzer )
{
}